

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ProgressCheck(Parse *p)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long *in_RDI;
  sqlite3 *db;
  
  lVar1 = *in_RDI;
  if (*(int *)(lVar1 + 400) != 0) {
    *(int *)((long)in_RDI + 0x34) = *(int *)((long)in_RDI + 0x34) + 1;
    *(undefined4 *)(in_RDI + 3) = 9;
  }
  if (*(long *)(lVar1 + 0x208) != 0) {
    if ((int)in_RDI[3] == 9) {
      *(undefined4 *)(in_RDI + 0x13) = 0;
    }
    else {
      uVar2 = (int)in_RDI[0x13] + 1;
      *(uint *)(in_RDI + 0x13) = uVar2;
      if (*(uint *)(lVar1 + 0x218) <= uVar2) {
        iVar3 = (**(code **)(lVar1 + 0x208))(*(undefined8 *)(lVar1 + 0x210));
        if (iVar3 != 0) {
          *(int *)((long)in_RDI + 0x34) = *(int *)((long)in_RDI + 0x34) + 1;
          *(undefined4 *)(in_RDI + 3) = 9;
        }
        *(undefined4 *)(in_RDI + 0x13) = 0;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ProgressCheck(Parse *p){
  sqlite3 *db = p->db;
  if( AtomicLoad(&db->u1.isInterrupted) ){
    p->nErr++;
    p->rc = SQLITE_INTERRUPT;
  }
#ifndef SQLITE_OMIT_PROGRESS_CALLBACK
  if( db->xProgress ){
    if( p->rc==SQLITE_INTERRUPT ){
      p->nProgressSteps = 0;
    }else if( (++p->nProgressSteps)>=db->nProgressOps ){
      if( db->xProgress(db->pProgressArg) ){
        p->nErr++;
        p->rc = SQLITE_INTERRUPT;
      }
      p->nProgressSteps = 0;
    }
  }
#endif
}